

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::JoinCommonEdges(Clipper *this,bool fixHoleLinkages)

{
  pointer *pppOVar1;
  int iVar2;
  int iVar3;
  JoinRec *pJVar4;
  ulong uVar5;
  OutPt *pOVar6;
  ulong uVar7;
  iterator __position;
  JoinRec *pJVar8;
  double dVar9;
  IntPoint pt2b;
  IntPoint pt1b;
  IntPoint pt1a;
  IntPoint pt2a;
  OutRec *pOVar10;
  bool bVar11;
  bool bVar12;
  pointer ppJVar13;
  OutPt *pp;
  OutPt *pp_00;
  OutPt *pOVar14;
  OutPt *pOVar15;
  long lVar16;
  OutPt *pOVar17;
  ulong uVar18;
  OutPt *pOVar19;
  long lVar20;
  OutPt *pOVar21;
  ulong uVar22;
  OutRec *pOVar23;
  undefined7 in_register_00000031;
  ulong uVar24;
  bool bVar25;
  IntPoint pt;
  IntPoint pt_00;
  IntPoint pt_01;
  IntPoint pt_02;
  IntPoint pt_03;
  IntPoint pt_04;
  OutRec *outRec2;
  OutPt *pp2a;
  OutPt *pp1a;
  IntPoint pt2;
  IntPoint pt1;
  IntPoint pt3;
  IntPoint pt4;
  OutRec *local_c0;
  OutPt *local_b8;
  OutRec *local_b0;
  undefined4 local_a4;
  OutPt *local_a0;
  ulong local_98;
  OutPt *local_90;
  IntPoint local_88;
  IntPoint local_78;
  vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *local_60;
  IntPoint local_58;
  IntPoint local_48;
  OutPt *local_38;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000031,fixHoleLinkages);
  ppJVar13 = (this->m_Joins).
             super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Joins).
      super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar13) {
    local_60 = (vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *)&this->m_PolyOuts;
    uVar22 = 0;
    do {
      pJVar4 = ppJVar13[uVar22];
      local_b0 = *(OutRec **)(*(long *)local_60 + (long)pJVar4->poly1Idx * 8);
      local_90 = local_b0->pts;
      local_c0 = *(OutRec **)(*(long *)local_60 + (long)pJVar4->poly2Idx * 8);
      local_a0 = local_c0->pts;
      local_78.X = (pJVar4->pt2a).X;
      local_78.Y = (pJVar4->pt2a).Y;
      local_88.X = (pJVar4->pt2b).X;
      local_88.Y = (pJVar4->pt2b).Y;
      local_58.X = (pJVar4->pt1a).X;
      local_58.Y = (pJVar4->pt1a).Y;
      local_48.X = (pJVar4->pt1b).X;
      local_48.Y = (pJVar4->pt1b).Y;
      bVar11 = FindSegment(&local_90,&local_78,&local_88);
      pOVar17 = local_90;
      if (bVar11) {
        if (pJVar4->poly1Idx == pJVar4->poly2Idx) {
          local_a0 = local_90->next;
          bVar11 = FindSegment(&local_a0,&local_58,&local_48);
          if ((bVar11) && (local_a0 != pOVar17)) {
LAB_00684dd5:
            pt1a.Y = local_78.Y;
            pt1a.X = local_78.X;
            pt1b.Y = local_88.Y;
            pt1b.X = local_88.X;
            pt2a.Y = local_58.Y;
            pt2a.X = local_58.X;
            pt2b.Y = local_48.Y;
            pt2b.X = local_48.X;
            bVar11 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,&local_78,&local_88);
            uVar18 = local_78.Y;
            pOVar17 = local_90;
            if (bVar11) {
              pOVar21 = local_90->prev;
              pOVar19 = (OutPt *)local_78.X;
              if ((((OutPt *)(local_90->pt).X != (OutPt *)local_78.X) ||
                  (pp = local_90, (local_90->pt).Y != local_78.Y)) &&
                 (((OutPt *)(pOVar21->pt).X != (OutPt *)local_78.X ||
                  (pp = pOVar21, (pOVar21->pt).Y != local_78.Y)))) {
                local_b8 = (OutPt *)local_78.X;
                pt.Y = local_78.Y;
                pt.X = local_78.Y;
                pp = InsertPolyPtBetween((ClipperLib *)local_90,pOVar21,(OutPt *)local_78.X,pt);
                pOVar19 = local_b8;
              }
              uVar24 = local_88.Y;
              pOVar14 = (OutPt *)(pOVar17->pt).X;
              local_38 = (OutPt *)local_88.X;
              if (((pOVar14 != (OutPt *)local_88.X) ||
                  (pp_00 = pOVar17, (pOVar17->pt).Y != local_88.Y)) &&
                 (((OutPt *)(pOVar21->pt).X != (OutPt *)local_88.X ||
                  (pp_00 = pOVar21, (pOVar21->pt).Y != local_88.Y)))) {
                local_b8 = pOVar19;
                if (pp == pOVar21 || pp == pOVar17) {
                  pt_00.Y = uVar18;
                  pt_00.X = local_88.Y;
                  pp_00 = InsertPolyPtBetween((ClipperLib *)pOVar17,pOVar21,(OutPt *)local_88.X,
                                              pt_00);
                  pOVar19 = local_b8;
                }
                else {
                  local_98 = uVar18;
                  uVar5 = (pOVar17->pt).Y;
                  if (uVar5 == local_88.Y && pOVar14 == (OutPt *)local_88.X) {
LAB_00684f5d:
                    pOVar21 = pp;
                    pOVar19 = pOVar17;
                  }
                  else {
                    pOVar19 = (OutPt *)(pp->pt).X;
                    uVar7 = (pp->pt).Y;
                    uVar18 = uVar7 ^ local_88.Y | (ulong)pOVar19 ^ local_88.X;
                    if (uVar18 == 0) goto LAB_00684f5d;
                    if (pOVar14 == pOVar19) {
                      bVar11 = (long)uVar5 < local_88.Y;
                      bVar25 = SBORROW8(local_88.Y,uVar7);
                      lVar16 = local_88.Y - uVar7;
                    }
                    else {
                      bVar11 = (long)pOVar14 < local_88.X;
                      bVar25 = SBORROW8(local_88.X,(long)pOVar19);
                      lVar16 = local_88.X - (long)pOVar19;
                    }
                    pOVar19 = pp;
                    if ((bool)(bVar25 == lVar16 < 0 ^ bVar11)) goto LAB_00684f5d;
                  }
                  pt_01.Y = uVar18;
                  pt_01.X = local_88.Y;
                  pp_00 = InsertPolyPtBetween((ClipperLib *)pOVar19,pOVar21,(OutPt *)local_88.X,
                                              pt_01);
                  pOVar19 = local_b8;
                  uVar18 = local_98;
                }
              }
              pOVar21 = local_a0;
              pOVar17 = local_a0->prev;
              if ((((OutPt *)(local_a0->pt).X != pOVar19) ||
                  (pOVar14 = local_a0, (local_a0->pt).Y != uVar18)) &&
                 (((OutPt *)(pOVar17->pt).X != pOVar19 ||
                  (pOVar14 = pOVar17, (pOVar17->pt).Y != uVar18)))) {
                local_98 = uVar24;
                pt_02.Y = uVar18;
                pt_02.X = uVar18;
                local_b8 = pp;
                pOVar14 = InsertPolyPtBetween((ClipperLib *)local_a0,pOVar17,pOVar19,pt_02);
                pp = local_b8;
                uVar24 = local_98;
              }
              pOVar19 = (OutPt *)(pOVar21->pt).X;
              if (((pOVar19 != local_38) || (pOVar15 = pOVar21, (pOVar21->pt).Y != uVar24)) &&
                 (((OutPt *)(pOVar17->pt).X != local_38 ||
                  (pOVar15 = pOVar17, (pOVar17->pt).Y != uVar24)))) {
                if (pOVar14 == pOVar17 || pOVar14 == pOVar21) {
                  pt_03.Y = uVar18;
                  pt_03.X = uVar24;
                  pOVar15 = InsertPolyPtBetween((ClipperLib *)pOVar21,pOVar17,local_38,pt_03);
                }
                else {
                  uVar5 = (pOVar21->pt).Y;
                  pOVar15 = pOVar14;
                  if (uVar5 != uVar24 || pOVar19 != local_38) {
                    pOVar6 = (OutPt *)(pOVar14->pt).X;
                    uVar7 = (pOVar14->pt).Y;
                    uVar18 = uVar7 ^ uVar24 | (ulong)pOVar6 ^ (ulong)local_38;
                    if (uVar18 != 0) {
                      if (pOVar19 == pOVar6) {
                        bVar11 = (long)uVar5 < (long)uVar24;
                        bVar25 = SBORROW8(uVar24,uVar7);
                        lVar16 = uVar24 - uVar7;
                      }
                      else {
                        bVar11 = (long)pOVar19 < (long)local_38;
                        bVar25 = SBORROW8((long)local_38,(long)pOVar6);
                        lVar16 = (long)local_38 - (long)pOVar6;
                      }
                      if (!(bool)(bVar25 == lVar16 < 0 ^ bVar11)) {
                        pOVar15 = pOVar17;
                        pOVar21 = pOVar14;
                      }
                    }
                  }
                  pt_04.Y = uVar18;
                  pt_04.X = uVar24;
                  local_b8 = pp;
                  pOVar15 = InsertPolyPtBetween((ClipperLib *)pOVar21,pOVar15,local_38,pt_04);
                  pp = local_b8;
                }
              }
              pOVar23 = local_b0;
              if ((pp->next == pp_00) && (pOVar14->prev == pOVar15)) {
                lVar16 = 0x18;
                lVar20 = 0x20;
              }
              else {
                if ((pp->prev != pp_00) || (pOVar14->next != pOVar15)) goto LAB_006850d2;
                lVar16 = 0x20;
                lVar20 = 0x18;
              }
              *(OutPt **)((long)&pp->idx + lVar16) = pOVar14;
              *(OutPt **)((long)&pOVar14->idx + lVar20) = pp;
              *(OutPt **)((long)&pp_00->idx + lVar20) = pOVar15;
              *(OutPt **)((long)&pOVar15->idx + lVar16) = pp_00;
              if (pJVar4->poly2Idx == pJVar4->poly1Idx) {
                pOVar17 = GetBottomPt(pp);
                pOVar23 = local_b0;
                local_b0->pts = pOVar17;
                local_b0->bottomPt = pOVar17;
                pOVar17->idx = local_b0->idx;
                local_c0 = (OutRec *)operator_new(0x38);
                local_c0->isHole = false;
                local_c0->FirstLeft = (OutRec *)0x0;
                local_c0->AppendLink = (OutRec *)0x0;
                local_c0->pts = (OutPt *)0x0;
                local_c0->bottomPt = (OutPt *)0x0;
                *(undefined8 *)((long)&local_c0->bottomPt + 4) = 0;
                *(undefined8 *)((long)&local_c0->bottomFlag + 4) = 0;
                __position._M_current =
                     (this->m_PolyOuts).
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_PolyOuts).
                    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>::
                  _M_realloc_insert<ClipperLib::OutRec*const&>(local_60,__position,&local_c0);
                }
                else {
                  *__position._M_current = local_c0;
                  pppOVar1 = &(this->m_PolyOuts).
                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppOVar1 = *pppOVar1 + 1;
                }
                pOVar10 = local_c0;
                local_c0->idx =
                     (int)((ulong)((long)(this->m_PolyOuts).
                                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->m_PolyOuts).
                                        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
                pJVar4->poly2Idx = local_c0->idx;
                pOVar17 = GetBottomPt(pp_00);
                pOVar10->pts = pOVar17;
                pOVar10->bottomPt = pOVar17;
                pOVar17->idx = pOVar10->idx;
                bVar11 = PointInPolygon(&local_c0->pts->pt,pOVar23->pts,
                                        (bool)(this->_vptr_Clipper[-3] + 0x10)
                                              [(long)&(this->m_PolyOuts).
                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                              ]);
                uVar18 = uVar22;
                if (bVar11) {
                  local_c0->isHole = (bool)(pOVar23->isHole ^ 1);
                  local_c0->FirstLeft = pOVar23;
                  bVar11 = local_c0->isHole;
                  bVar25 = this->m_ReverseOutput;
                  bVar12 = Orientation(local_c0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                      [(long)&(this->m_PolyOuts).
                                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  pOVar23 = local_b0;
                  if (bVar11 == (bool)(bVar12 ^ bVar25)) {
                    pOVar17 = local_c0->pts;
                    pOVar21 = pOVar17;
                    do {
                      pOVar19 = pOVar21->next;
                      pOVar21->next = pOVar21->prev;
                      pOVar21->prev = pOVar19;
                      pOVar21 = pOVar19;
                    } while (pOVar19 != pOVar17);
                  }
                }
                else {
                  bVar11 = PointInPolygon(&pOVar23->pts->pt,local_c0->pts,
                                          (bool)(this->_vptr_Clipper[-3] + 0x10)
                                                [(long)&(this->m_PolyOuts).
                                                                                                                
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                ]);
                  local_c0->isHole = pOVar23->isHole;
                  if (bVar11) {
                    pOVar23->isHole = (bool)(local_c0->isHole ^ 1);
                    local_c0->FirstLeft = pOVar23->FirstLeft;
                    pOVar23->FirstLeft = local_c0;
                    bVar11 = local_b0->isHole;
                    bVar25 = this->m_ReverseOutput;
                    bVar12 = Orientation(local_b0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                        [(long)&(this->m_PolyOuts).
                                                                                                                                
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                    if (bVar11 == (bool)(bVar12 ^ bVar25)) {
                      pOVar17 = local_b0->pts;
                      pOVar21 = pOVar17;
                      do {
                        pOVar19 = pOVar21->next;
                        pOVar21->next = pOVar21->prev;
                        pOVar21->prev = pOVar19;
                        pOVar21 = pOVar19;
                      } while (pOVar19 != pOVar17);
                    }
                    pOVar23 = local_b0;
                  }
                  else {
                    local_c0->FirstLeft = pOVar23->FirstLeft;
                  }
                  if ((char)local_a4 != '\0') {
                    CheckHoleLinkages1(this,pOVar23,local_c0);
                  }
                }
                while( true ) {
                  uVar18 = uVar18 + 1;
                  ppJVar13 = (this->m_Joins).
                             super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->m_Joins).
                                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar13 >> 3
                             ) <= uVar18) break;
                  pJVar8 = ppJVar13[uVar18];
                  if (pJVar8->poly1Idx == pJVar4->poly1Idx) {
                    pOVar17 = pp_00;
                    do {
                      bVar11 = (pOVar17->pt).Y == (pJVar8->pt1a).Y;
                      bVar25 = (pOVar17->pt).X == (pJVar8->pt1a).X;
                      if (bVar11 && bVar25) goto LAB_00685432;
                      pOVar17 = pOVar17->next;
                    } while (pOVar17 != pp_00);
                    if (bVar11 && bVar25) {
LAB_00685432:
                      pJVar8->poly1Idx = pJVar4->poly2Idx;
                    }
                  }
                  if (pJVar8->poly2Idx == pJVar4->poly1Idx) {
                    pOVar17 = pp_00;
                    do {
                      bVar11 = (pOVar17->pt).Y == (pJVar8->pt2a).Y;
                      bVar25 = (pOVar17->pt).X == (pJVar8->pt2a).X;
                      if (bVar11 && bVar25) goto LAB_00685472;
                      pOVar17 = pOVar17->next;
                    } while (pOVar17 != pp_00);
                    if (bVar11 && bVar25) {
LAB_00685472:
                      pJVar8->poly2Idx = pJVar4->poly2Idx;
                    }
                  }
                }
                FixupOutPolygon(this,pOVar23);
                FixupOutPolygon(this,local_c0);
                if (pOVar23->pts != (OutPt *)0x0) {
                  bVar11 = Orientation(pOVar23,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                     [(long)&(this->m_PolyOuts).
                                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  dVar9 = Area(local_b0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                              [(long)&(this->m_PolyOuts).
                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                              ]);
                  if (dVar9 <= 0.0 == bVar11) {
                    DisposeBottomPt(this,local_b0);
                  }
                }
                if (local_c0->pts != (OutPt *)0x0) {
                  bVar11 = Orientation(local_c0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                      [(long)&(this->m_PolyOuts).
                                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  dVar9 = Area(local_c0,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                              [(long)&(this->m_PolyOuts).
                                                                                                            
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                              ]);
                  if (dVar9 <= 0.0 == bVar11) {
                    DisposeBottomPt(this,local_c0);
                  }
                }
              }
              else {
                if ((char)local_a4 != '\0') {
                  CheckHoleLinkages2(this,local_b0,local_c0);
                }
                FixupOutPolygon(this,pOVar23);
                if (pOVar23->pts != (OutPt *)0x0) {
                  bVar11 = Orientation(pOVar23,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                                     [(long)&(this->m_PolyOuts).
                                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ]);
                  pOVar23->isHole = !bVar11;
                  if ((!bVar11) && (pOVar23->FirstLeft == (OutRec *)0x0)) {
                    pOVar23->FirstLeft = local_c0->FirstLeft;
                  }
                }
                iVar2 = pOVar23->idx;
                iVar3 = local_c0->idx;
                local_c0->pts = (OutPt *)0x0;
                local_c0->bottomPt = (OutPt *)0x0;
                local_c0->AppendLink = pOVar23;
                uVar18 = uVar22;
                while( true ) {
                  uVar18 = uVar18 + 1;
                  ppJVar13 = (this->m_Joins).
                             super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)((long)(this->m_Joins).
                                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar13 >> 3
                             ) <= uVar18) break;
                  pJVar4 = ppJVar13[uVar18];
                  if (pJVar4->poly1Idx == iVar3) {
                    pJVar4->poly1Idx = iVar2;
                  }
                  if (pJVar4->poly2Idx == iVar3) {
                    pJVar4->poly2Idx = iVar2;
                  }
                }
              }
            }
          }
        }
        else {
          bVar11 = FindSegment(&local_a0,&local_58,&local_48);
          if (bVar11) goto LAB_00684dd5;
        }
      }
LAB_006850d2:
      uVar22 = uVar22 + 1;
      ppJVar13 = (this->m_Joins).
                 super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar22 < (ulong)((long)(this->m_Joins).
                                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar13 >> 3
                             ));
  }
  return;
}

Assistant:

void Clipper::JoinCommonEdges(bool fixHoleLinkages)
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
  {
    JoinRec* j = m_Joins[i];
    OutRec *outRec1 = m_PolyOuts[j->poly1Idx];
    OutPt *pp1a = outRec1->pts;
    OutRec *outRec2 = m_PolyOuts[j->poly2Idx];
    OutPt *pp2a = outRec2->pts;
    IntPoint pt1 = j->pt2a, pt2 = j->pt2b;
    IntPoint pt3 = j->pt1a, pt4 = j->pt1b;
    if (!FindSegment(pp1a, pt1, pt2)) continue;
    if (j->poly1Idx == j->poly2Idx)
    {
      //we're searching the same polygon for overlapping segments so
      //segment 2 mustn't be the same as segment 1 ...
      pp2a = pp1a->next;
      if (!FindSegment(pp2a, pt3, pt4) || (pp2a == pp1a)) continue;
    }
    else if (!FindSegment(pp2a, pt3, pt4)) continue;

    if (!GetOverlapSegment(pt1, pt2, pt3, pt4, pt1, pt2)) continue;

    OutPt *p1, *p2, *p3, *p4;
    OutPt *prev = pp1a->prev;
    //get p1 & p2 polypts - the overlap start & endpoints on poly1
    if (PointsEqual(pp1a->pt, pt1)) p1 = pp1a;
    else if (PointsEqual(prev->pt, pt1)) p1 = prev;
    else p1 = InsertPolyPtBetween(pp1a, prev, pt1);

    if (PointsEqual(pp1a->pt, pt2)) p2 = pp1a;
    else if (PointsEqual(prev->pt, pt2)) p2 = prev;
    else if ((p1 == pp1a) || (p1 == prev))
      p2 = InsertPolyPtBetween(pp1a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp1a->pt, p1->pt, pt2))
      p2 = InsertPolyPtBetween(pp1a, p1, pt2); else
      p2 = InsertPolyPtBetween(p1, prev, pt2);

    //get p3 & p4 polypts - the overlap start & endpoints on poly2
    prev = pp2a->prev;
    if (PointsEqual(pp2a->pt, pt1)) p3 = pp2a;
    else if (PointsEqual(prev->pt, pt1)) p3 = prev;
    else p3 = InsertPolyPtBetween(pp2a, prev, pt1);

    if (PointsEqual(pp2a->pt, pt2)) p4 = pp2a;
    else if (PointsEqual(prev->pt, pt2)) p4 = prev;
    else if ((p3 == pp2a) || (p3 == prev))
      p4 = InsertPolyPtBetween(pp2a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp2a->pt, p3->pt, pt2))
      p4 = InsertPolyPtBetween(pp2a, p3, pt2); else
      p4 = InsertPolyPtBetween(p3, prev, pt2);

    //p1.pt == p3.pt and p2.pt == p4.pt so join p1 to p3 and p2 to p4 ...
    if (p1->next == p2 && p3->prev == p4)
    {
      p1->next = p3;
      p3->prev = p1;
      p2->prev = p4;
      p4->next = p2;
    }
    else if (p1->prev == p2 && p3->next == p4)
    {
      p1->prev = p3;
      p3->next = p1;
      p2->next = p4;
      p4->prev = p2;
    }
    else
      continue; //an orientation is probably wrong

    if (j->poly2Idx == j->poly1Idx)
    {
      //instead of joining two polygons, we've just created a new one by
      //splitting one polygon into two.
      outRec1->pts = GetBottomPt(p1);
      outRec1->bottomPt = outRec1->pts;
      outRec1->bottomPt->idx = outRec1->idx;
      outRec2 = CreateOutRec();
      m_PolyOuts.push_back(outRec2);
      outRec2->idx = (int)m_PolyOuts.size()-1;
      j->poly2Idx = outRec2->idx;
      outRec2->pts = GetBottomPt(p2);
      outRec2->bottomPt = outRec2->pts;
      outRec2->bottomPt->idx = outRec2->idx;

      if (PointInPolygon(outRec2->pts->pt, outRec1->pts, m_UseFullRange))
      {
        //outRec2 is contained by outRec1 ...
        outRec2->isHole = !outRec1->isHole;
        outRec2->FirstLeft = outRec1;
        if (outRec2->isHole ==
          (m_ReverseOutput ^ Orientation(outRec2, m_UseFullRange)))
            ReversePolyPtLinks(*outRec2->pts);
      } else if (PointInPolygon(outRec1->pts->pt, outRec2->pts, m_UseFullRange))
      {
        //outRec1 is contained by outRec2 ...
        outRec2->isHole = outRec1->isHole;
        outRec1->isHole = !outRec2->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        outRec1->FirstLeft = outRec2;
        if (outRec1->isHole ==
          (m_ReverseOutput ^ Orientation(outRec1, m_UseFullRange)))
            ReversePolyPtLinks(*outRec1->pts);
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      } else
      {
        outRec2->isHole = outRec1->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      }

      //now fixup any subsequent joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == j->poly1Idx && PointIsVertex(j2->pt1a, p2))
          j2->poly1Idx = j->poly2Idx;
        if (j2->poly2Idx == j->poly1Idx && PointIsVertex(j2->pt2a, p2))
          j2->poly2Idx = j->poly2Idx;
      }

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);
      FixupOutPolygon(*outRec2);

      if (outRec1->pts && (Orientation(outRec1, m_UseFullRange) != (Area(*outRec1, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec1);
      if (outRec2->pts && (Orientation(outRec2, m_UseFullRange) != (Area(*outRec2, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec2);

    } else
    {
      //joined 2 polygons together ...

      //make sure any holes contained by outRec2 now link to outRec1 ...
      if (fixHoleLinkages) CheckHoleLinkages2(outRec1, outRec2);

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);

      if (outRec1->pts)
      {
        outRec1->isHole = !Orientation(outRec1, m_UseFullRange);
        if (outRec1->isHole && !outRec1->FirstLeft)
          outRec1->FirstLeft = outRec2->FirstLeft;
      }

      //delete the obsolete pointer ...
      int OKIdx = outRec1->idx;
      int ObsoleteIdx = outRec2->idx;
      outRec2->pts = 0;
      outRec2->bottomPt = 0;
      outRec2->AppendLink = outRec1;

      //now fixup any subsequent Joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == ObsoleteIdx) j2->poly1Idx = OKIdx;
        if (j2->poly2Idx == ObsoleteIdx) j2->poly2Idx = OKIdx;
      }
    }
  }
}